

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotManager.hpp
# Opt level: O1

void __thiscall OpenMD::SnapshotManager::~SnapshotManager(SnapshotManager *this)

{
  Snapshot *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->_vptr_SnapshotManager = (_func_int **)&PTR__SnapshotManager_002ffaa8;
  pSVar1 = this->currentSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    p_Var2 = (pSVar1->frameData).spfData.
             super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    DataStorage::~DataStorage(&pSVar1->cgData);
    DataStorage::~DataStorage(&pSVar1->rigidbodyData);
    DataStorage::~DataStorage(&pSVar1->atomData);
    operator_delete(pSVar1,0xa98);
  }
  pSVar1 = this->previousSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    p_Var2 = (pSVar1->frameData).spfData.
             super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    DataStorage::~DataStorage(&pSVar1->cgData);
    DataStorage::~DataStorage(&pSVar1->rigidbodyData);
    DataStorage::~DataStorage(&pSVar1->atomData);
    operator_delete(pSVar1,0xa98);
    return;
  }
  return;
}

Assistant:

virtual ~SnapshotManager() {
      delete currentSnapshot_;
      delete previousSnapshot_;
    }